

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  *(undefined ***)&this->field_0xc0 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xc8 = 0;
  *(char **)&this->field_0xd0 = "IfcCShapeProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__0074e6e8);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x74e658;
  *(undefined8 *)&this->field_0xc0 = 0x74e6d0;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x74e680
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x74e6a8;
  (this->InternalFilletRadius).have = false;
  (this->CentreOfGravityInX).have = false;
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}